

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_feature(lysp_yang_ctx *ctx,lysp_feature **features)

{
  lysp_ext_instance **exts;
  lysp_feature *plVar1;
  LY_ERR LVar2;
  long *plVar3;
  char *pcVar4;
  uint16_t *puVar5;
  ly_stmt parent_stmt;
  ly_ctx *plVar6;
  long lVar7;
  void *parent;
  Elf64_Ehdr *exts_00;
  uint16_t *puVar8;
  char **str_p;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  lysp_ext_instance **in_stack_ffffffffffffff90;
  ly_stmt local_64;
  char *local_60;
  size_t local_58;
  lysp_qname **local_50;
  uint16_t *local_48;
  uint16_t *local_40;
  long local_38;
  
  plVar1 = *features;
  if (plVar1 == (lysp_feature *)0x0) {
    plVar3 = (long *)malloc(0x48);
    if (plVar3 == (long *)0x0) goto LAB_00179f5f;
    *plVar3 = 1;
    lVar7 = 1;
  }
  else {
    lVar7 = *(long *)&plVar1[-1].flags + 1;
    *(long *)&plVar1[-1].flags = lVar7;
    plVar3 = (long *)realloc(&plVar1[-1].flags,lVar7 * 0x40 | 8);
    if (plVar3 == (long *)0x0) {
      *(long *)&(*features)[-1].flags = *(long *)&(*features)[-1].flags + -1;
LAB_00179f5f:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_feature");
      return LY_EMEM;
    }
    lVar7 = *plVar3;
  }
  *features = (lysp_feature *)(plVar3 + 1);
  plVar3[lVar7 * 8 + -1] = 0;
  (plVar3 + lVar7 * 8 + -1)[1] = 0;
  plVar3[lVar7 * 8 + -3] = 0;
  (plVar3 + lVar7 * 8 + -3)[1] = 0;
  plVar3[lVar7 * 8 + -5] = 0;
  (plVar3 + lVar7 * 8 + -5)[1] = 0;
  plVar3[lVar7 * 8 + -7] = 0;
  (plVar3 + lVar7 * 8 + -7)[1] = 0;
  exts_00 = (Elf64_Ehdr *)&stack0xffffffffffffffc8;
  LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_60,(char **)exts_00,&local_58);
  if (LVar2 == LY_SUCCESS) {
    str_p = (char **)(plVar3 + lVar7 * 8 + -7);
    if (local_38 == 0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar4 = local_60;
      if (local_58 == 0) {
        pcVar4 = "";
      }
      LVar2 = lydict_insert(plVar6,pcVar4,local_58,str_p);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar2 = lydict_insert_zc(plVar6,local_60,str_p);
    }
    if (((LVar2 == LY_SUCCESS) &&
        (LVar2 = get_keyword(ctx,&local_64,&local_60,&local_58), LVar2 == LY_SUCCESS)) &&
       (LVar2 = LY_SUCCESS, local_64 != LY_STMT_SYNTAX_SEMICOLON)) {
      if (local_64 == LY_STMT_SYNTAX_LEFT_BRACE) {
        LVar2 = get_keyword(ctx,&local_64,&local_60,&local_58);
        if ((LVar2 == LY_SUCCESS) && (LVar2 = LY_SUCCESS, local_64 != LY_STMT_SYNTAX_RIGHT_BRACE)) {
          local_40 = (uint16_t *)(plVar3 + lVar7 * 8);
          exts = (lysp_ext_instance **)(local_40 + -4);
          local_48 = local_40 + -8;
          local_50 = (lysp_qname **)(local_40 + -0x18);
          puVar8 = local_40 + -0xc;
          do {
            if ((int)local_64 < 0x130000) {
              if (local_64 == LY_STMT_DESCRIPTION) {
                parent = *(void **)puVar8;
                parent_stmt = LY_STMT_DESCRIPTION;
                puVar5 = puVar8;
LAB_0017a137:
                exts_00 = (Elf64_Ehdr *)0x2;
                LVar2 = parse_text_field(ctx,parent,parent_stmt,(uint32_t)puVar5,(char **)0x2,
                                         Y_IDENTIF_ARG,(uint16_t *)exts,in_stack_ffffffffffffff90);
              }
              else {
                if (local_64 != LY_STMT_EXTENSION_INSTANCE) {
LAB_0017a206:
                  if (ctx == (lysp_yang_ctx *)0x0) {
                    plVar6 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar6 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar4 = lyplg_ext_stmt2str(local_64);
                  ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"feature");
                  goto LAB_0017a1fc;
                }
                exts_00 = &Elf64_Ehdr_00100000;
                LVar2 = parse_ext(ctx,local_60,local_58,str_p,LY_STMT_FEATURE,0,exts);
              }
            }
            else if (local_64 == LY_STMT_IF_FEATURE) {
              LVar2 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_50,(yang_arg)exts,
                                   (lysp_ext_instance **)exts_00);
            }
            else {
              if (local_64 == LY_STMT_REFERENCE) {
                parent = *(void **)local_48;
                parent_stmt = LY_STMT_REFERENCE;
                puVar5 = local_48;
                goto LAB_0017a137;
              }
              if (local_64 != LY_STMT_STATUS) goto LAB_0017a206;
              LVar2 = parse_status(ctx,local_40,exts);
            }
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            LVar2 = get_keyword(ctx,&local_64,&local_60,&local_58);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
          } while (local_64 != LY_STMT_SYNTAX_RIGHT_BRACE);
          if ((*exts == (lysp_ext_instance *)0x0) ||
             (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
             LVar2 == LY_SUCCESS)) {
            LVar2 = LY_SUCCESS;
          }
        }
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = lyplg_ext_stmt2str(local_64);
        ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
LAB_0017a1fc:
        LVar2 = LY_EVALID;
      }
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
parse_feature(struct lysp_yang_ctx *ctx, struct lysp_feature **features)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_feature *feat;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *features, feat, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, feat->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, feat->dsc, LY_STMT_DESCRIPTION, 0, &feat->dsc, Y_STR_ARG, NULL, &feat->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &feat->iffeatures, Y_STR_ARG, &feat->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, feat->ref, LY_STMT_REFERENCE, 0, &feat->ref, Y_STR_ARG, NULL, &feat->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &feat->flags, &feat->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, feat, LY_STMT_FEATURE, 0, &feat->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "feature");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, feat->exts, ret, cleanup);
    }

cleanup:
    return ret;
}